

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_dec.c
# Opt level: O2

WebPImageReader WebPGetImageReader(WebPInputFileFormat format)

{
  if (format < WEBP_UNSUPPORTED_FORMAT) {
    return (WebPImageReader)(&PTR_ReadPNG_0015ebc0)[format];
  }
  return FailReader;
}

Assistant:

WebPImageReader WebPGetImageReader(WebPInputFileFormat format) {
  switch (format) {
    case WEBP_PNG_FORMAT: return ReadPNG;
    case WEBP_JPEG_FORMAT: return ReadJPEG;
    case WEBP_TIFF_FORMAT: return ReadTIFF;
    case WEBP_WEBP_FORMAT: return ReadWebP;
    case WEBP_PNM_FORMAT: return ReadPNM;
    default: return FailReader;
  }
}